

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode_traits.hpp
# Opt level: O1

bool __thiscall
jsoncons::typed_array_visitor<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::
visit_double(typed_array_visitor<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *this,
            double value,semantic_tag param_2,ser_context *param_3,error_code *param_4)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  iterator __position;
  ulong local_8;
  
  this_00 = this->v_;
  local_8 = (long)(value - 9.223372036854776e+18) & (long)value >> 0x3f | (long)value;
  __position._M_current =
       (this_00->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this_00->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
              (this_00,__position,&local_8);
  }
  else {
    *__position._M_current = local_8;
    (this_00->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_double(double value, 
            semantic_tag,
            const ser_context&,
            std::error_code&) override
        {
            v_.push_back(static_cast<value_type>(value));
            JSONCONS_VISITOR_RETURN;
        }